

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# policy.cc
# Opt level: O1

X509_POLICY_NODE * x509_policy_node_new(ASN1_OBJECT *policy)

{
  int iVar1;
  X509_POLICY_NODE *node;
  ASN1_OBJECT *pAVar2;
  OPENSSL_STACK *pOVar3;
  
  iVar1 = OBJ_obj2nid((ASN1_OBJECT *)policy);
  if (iVar1 == 0x2ea) {
    __assert_fail("!is_any_policy(policy)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/policy.cc"
                  ,0x6b,"X509_POLICY_NODE *x509_policy_node_new(const ASN1_OBJECT *)");
  }
  node = (X509_POLICY_NODE *)OPENSSL_zalloc(0x18);
  if (node != (X509_POLICY_NODE *)0x0) {
    pAVar2 = OBJ_dup((ASN1_OBJECT *)policy);
    node->policy = (ASN1_OBJECT *)pAVar2;
    pOVar3 = OPENSSL_sk_new_null();
    node->parent_policies = (stack_st_ASN1_OBJECT *)pOVar3;
    if (pOVar3 != (OPENSSL_STACK *)0x0 && node->policy != (ASN1_OBJECT *)0x0) {
      return node;
    }
    x509_policy_node_free(node);
  }
  return (X509_POLICY_NODE *)0x0;
}

Assistant:

static X509_POLICY_NODE *x509_policy_node_new(const ASN1_OBJECT *policy) {
  assert(!is_any_policy(policy));
  X509_POLICY_NODE *node = reinterpret_cast<X509_POLICY_NODE *>(
      OPENSSL_zalloc(sizeof(X509_POLICY_NODE)));
  if (node == NULL) {
    return NULL;
  }
  node->policy = OBJ_dup(policy);
  node->parent_policies = sk_ASN1_OBJECT_new_null();
  if (node->policy == NULL || node->parent_policies == NULL) {
    x509_policy_node_free(node);
    return NULL;
  }
  return node;
}